

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-stairs.c
# Opt level: O2

_Bool borg_flow_stair_more(int why,_Bool sneak,_Bool brave)

{
  _Bool _Var1;
  int16_t iVar2;
  wchar_t wVar3;
  char *pcVar4;
  long lVar5;
  
  if (track_more.num == 0) {
    return false;
  }
  if (track_less.num == 0) {
    if (borg.goal.recalling != L'\0') {
      return false;
    }
    goto LAB_0020cf5a;
  }
  if ((((!borg.lunal_mode) && (!borg.munchkin_mode)) && (!brave)) &&
     (pcVar4 = borg_prepared(borg.trait[0x69] + L'\x01'), pcVar4 != (char *)0x0)) {
    return false;
  }
  if (brave) {
    if (borg.trait[0x69] != 0) {
LAB_0020cf04:
      if (((borg.trait[0x23] < 0x19) && (borg.trait[0x2d] < 25000)) &&
         ((wVar3 = borg_count_sell(), L'\f' < wVar3 && (borg.munchkin_mode != true)))) {
        return false;
      }
    }
  }
  else if (borg.trait[0x69] != 0) {
    if (scaryguy_on_level == false) {
      if (borg.trait[0x6c] != 0) {
        return false;
      }
      if (borg.trait[0x6d] != 0) {
        return false;
      }
      if (borg.trait[0x27] < 2) {
        return false;
      }
    }
    goto LAB_0020cf04;
  }
  if (borg.munchkin_mode == false && borg.trait[0x1a] == 0) {
    return false;
  }
  if (borg.goal.recalling != L'\0') {
    return false;
  }
LAB_0020cf5a:
  borg_flow_clear();
  iVar2 = track_more.num;
  for (lVar5 = 0; lVar5 < iVar2; lVar5 = lVar5 + 1) {
    if (borg_grids[track_more.y[lVar5]][track_more.x[lVar5]].kill == '\0') {
      borg_flow_enqueue_grid(track_more.y[lVar5],track_more.x[lVar5]);
      iVar2 = track_more.num;
    }
  }
  borg_flow_spread(L'ú',true,false,false,L'\xffffffff',sneak);
  _Var1 = borg_flow_commit("down-stairs",why);
  if (!_Var1) {
    return false;
  }
  _Var1 = borg_flow_old(why);
  return _Var1;
}

Assistant:

bool borg_flow_stair_more(int why, bool sneak, bool brave)
{
    int i;

    /* None to flow to */
    if (!track_more.num)
        return false;

    /* if there are no down stairs, don't filter use of up stairs */
    if (track_less.num) {
        /* not unless safe or munchkin/Lunal Mode or brave */
        if (!borg.lunal_mode && !borg.munchkin_mode && !brave
            && (char *)NULL != borg_prepared(borg.trait[BI_CDEPTH] + 1))
            return false;

        /* dont go down if hungry or low on food, unless fleeing a scary town */
        if (!brave && borg.trait[BI_CDEPTH] && !scaryguy_on_level
            && (borg.trait[BI_ISWEAK] || borg.trait[BI_ISHUNGRY]
                || borg.trait[BI_FOOD] < 2))
            return false;

        /* If I need to sell crap, then don't go down */
        if (borg.trait[BI_CDEPTH] && borg.trait[BI_CLEVEL] < 25
            && borg.trait[BI_GOLD] < 25000 && borg_count_sell() >= 13
            && !borg.munchkin_mode)
            return false;

        /* No diving if no light */
        if (borg.trait[BI_LIGHT] == 0 && borg.munchkin_mode == false)
            return false;
    }

    /* don't head for the stairs if you are recalling,  */
    /* even if you are fleeing. */
    if (borg.goal.recalling)
        return false;

    /* Clear the flow codes */
    borg_flow_clear();

    /* Enqueue useful grids */
    for (i = 0; i < track_more.num; i++) {
        /* Not if a monster is parked on the stair */
        if (borg_grids[track_more.y[i]][track_more.x[i]].kill)
            continue;

        /* Enqueue the grid */
        borg_flow_enqueue_grid(track_more.y[i], track_more.x[i]);
    }

    /* Spread the flow */
    borg_flow_spread(250, true, false, false, -1, sneak);

    /* Attempt to Commit the flow */
    if (!borg_flow_commit("down-stairs", why))
        return false;

    /* Take one step */
    if (!borg_flow_old(why))
        return false;

    /* Success */
    return true;
}